

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erase_suite.cpp
# Opt level: O0

void key_erase_suite::erase_null(void)

{
  bool bVar1;
  int *in_RCX;
  undefined1 local_11c [84];
  undefined1 local_c8 [8];
  key_iterator it;
  undefined1 local_68 [8];
  variable data2;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            ((key_iterator *)local_c8,
             (basic_variable<std::allocator<char>_> *)&data2.storage.field_0x28);
  local_11c._0_4_ = 0;
  trial::dynamic::key::erase<std::allocator<char>,int>
            ((key_iterator *)(local_11c + 4),(key *)&data2.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)local_11c,in_RCX);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator==
                    ((key_iterator *)(local_11c + 4),(key_iterator *)local_c8);
  boost::detail::test_impl
            ("key::erase(data, 0) == it",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/erase_suite.cpp"
             ,0x1d,"void key_erase_suite::erase_null()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator
            ((key_iterator *)(local_11c + 4));
  bVar1 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)&data2.storage.field_0x28,
                     (basic_variable<std::allocator<char>_> *)local_68);
  boost::detail::test_impl
            ("data == data2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/erase_suite.cpp"
             ,0x1e,"void key_erase_suite::erase_null()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator
            ((key_iterator *)local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data2.storage.field_0x28);
  return;
}

Assistant:

void erase_null()
{
    variable data, data2;
    // Cannot iterate over null, so nothing changes
    auto it = data.key_begin();
    TRIAL_PROTOCOL_TEST(key::erase(data, 0) == it);
    TRIAL_PROTOCOL_TEST(data == data2);
}